

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O2

void __thiscall MacProj::install_level(MacProj *this,int level,AmrLevel *level_data)

{
  ostringstream *this_00;
  pointer puVar1;
  tuple<amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_> tVar2;
  AmrLevel *pAVar3;
  pointer pIVar4;
  int iVar5;
  ostream *os_;
  __uniq_ptr_data<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>,_true,_true> this_01
  ;
  int iVar6;
  long lVar7;
  Print local_1b0;
  
  if (verbose != 0) {
    os_ = amrex::OutStream();
    amrex::Print::Print(&local_1b0,os_);
    this_00 = &local_1b0.ss;
    std::operator<<((ostream *)this_00,"Installing MacProj level ");
    std::ostream::operator<<(this_00,level);
    std::operator<<((ostream *)this_00,'\n');
    amrex::Print::~Print(&local_1b0);
  }
  iVar5 = *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  iVar6 = this->finest_level;
  if (iVar5 < iVar6) {
    lVar7 = (long)iVar5;
    do {
      do {
        if (iVar6 <= lVar7) {
          iVar5 = *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
          goto LAB_0025eb31;
        }
        puVar1 = (this->mac_reg).
                 super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tVar2.
        super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
        super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_> *)
              &puVar1[lVar7 + 1]._M_t.
               super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>
        ;
        puVar1[lVar7 + 1]._M_t.
        super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_> =
             (__uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>)0x0;
        lVar7 = lVar7 + 1;
      } while (tVar2.
               super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
               .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl ==
               (_Head_base<0UL,_amrex::FluxRegister_*,_false>)0x0);
      (**(code **)(*(long *)tVar2.
                            super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
                            .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl + 8))
                ();
      iVar6 = this->finest_level;
    } while( true );
  }
LAB_0025eb31:
  this->finest_level = iVar5;
  if (this->finest_level_allocated < level) {
    this->finest_level_allocated = iVar5;
    std::vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::resize
              (&(this->LevelData).
                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>,
               (long)(iVar5 + 1));
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::resize(&(this->mac_phi_crse).
              super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ,(long)this->finest_level + 1);
    std::
    vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
    ::resize(&(this->mac_reg).
              super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
             ,(long)this->finest_level + 1);
  }
  (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
  super__Vector_impl_data._M_start[level] = level_data;
  if (0 < level) {
    puVar1 = (this->mac_reg).
             super_vector<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>,_std::allocator<std::unique_ptr<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_01.super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>.
    _M_t.super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
    super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>)
         operator_new(0x988);
    pAVar3 = (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
             super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
             super__Vector_impl_data._M_start[level];
    pIVar4 = (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_1b0._0_8_ = *(undefined8 *)pIVar4[(ulong)(uint)level + 0xffffffffffffffff].vect;
    local_1b0.os._0_4_ = *(int *)((long)(pIVar4 + (ulong)(uint)level + 0xffffffffffffffff) + 8);
    amrex::FluxRegister::FluxRegister
              ((FluxRegister *)
               this_01.
               super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
               .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl,&pAVar3->grids,
               &pAVar3->dmap,(IntVect *)&local_1b0,level,1);
    tVar2.super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
    super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_> *)
          &puVar1[(uint)level]._M_t.
           super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>;
    puVar1[(uint)level]._M_t.
    super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_> =
         this_01.
         super___uniq_ptr_impl<amrex::FluxRegister,_std::default_delete<amrex::FluxRegister>_>._M_t.
         super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
         super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl;
    if (tVar2.
        super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>.
        super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::FluxRegister_*,_false>)0x0) {
      (**(code **)(*(long *)tVar2.
                            super__Tuple_impl<0UL,_amrex::FluxRegister_*,_std::default_delete<amrex::FluxRegister>_>
                            .super__Head_base<0UL,_amrex::FluxRegister_*,_false>._M_head_impl + 8))
                ();
    }
  }
  return;
}

Assistant:

void
MacProj::install_level (int       level,
                        AmrLevel* level_data)
{
    if (verbose) amrex::Print() << "Installing MacProj level " << level << '\n';
    if (parent->finestLevel() < finest_level)
        for (int lev = parent->finestLevel() + 1; lev <= finest_level; lev++)
            mac_reg[lev].reset();

    finest_level = parent->finestLevel();

    if (level > finest_level_allocated)
    {
        finest_level_allocated = finest_level;
        LevelData.resize(finest_level+1);
        mac_phi_crse.resize(finest_level+1);
        mac_reg.resize(finest_level+1);
    }

    LevelData[level] = level_data;

    if (level > 0)
    {
        mac_reg[level].reset(new FluxRegister(LevelData[level]->boxArray(),
                                              LevelData[level]->DistributionMap(),
                                              parent->refRatio(level-1),level,1));
    }

}